

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaMultiGenerator::InspectConfigTypeVariables(cmGlobalNinjaMultiGenerator *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> _Var1;
  cmake *pcVar2;
  bool bVar3;
  string *psVar4;
  size_type sVar5;
  string *psVar6;
  ostream *poVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string defaultConfigsString;
  cmList configsList;
  optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  defaultConfigs;
  optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  crossConfigs;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_238;
  string local_228;
  cmList defaultConfigsList;
  cmList crossConfigsList;
  ostringstream msg;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  
  _Var1._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (((this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.super_cmGlobalGenerator.
         Makefiles.
         super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&crossConfigs,"CMAKE_CONFIGURATION_TYPES",(allocator<char> *)&defaultConfigs)
  ;
  psVar4 = (string *)
           cmMakefile::GetDefinition
                     ((cmMakefile *)
                      _Var1._M_t.
                      super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                      (string *)&crossConfigs);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&msg,(string *)psVar4);
  init._M_len = 1;
  init._M_array = (iterator)&msg;
  cmList::cmList(&configsList,init);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&crossConfigs);
  if (configsList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      configsList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&configsList.Values);
  }
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  set<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&configs,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )configsList.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )configsList.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  _Var1._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (((this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.super_cmGlobalGenerator.
         Makefiles.
         super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"CMAKE_DEFAULT_BUILD_TYPE",(allocator<char> *)&crossConfigs);
  cmMakefile::GetSafeDefinition
            ((cmMakefile *)
             _Var1._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(string *)&msg);
  psVar4 = &(this->super_cmGlobalNinjaGenerator).DefaultFileConfig;
  std::__cxx11::string::_M_assign((string *)psVar4);
  std::__cxx11::string::~string((string *)&msg);
  if ((this->super_cmGlobalNinjaGenerator).DefaultFileConfig._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  sVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&configs,psVar4);
  if (sVar5 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar7 = std::operator<<((ostream *)&msg,"The configuration specified by ");
    poVar7 = std::operator<<(poVar7,"CMAKE_DEFAULT_BUILD_TYPE (");
    poVar7 = std::operator<<(poVar7,(string *)psVar4);
    std::operator<<(poVar7,") is not present in CMAKE_CONFIGURATION_TYPES");
    pcVar2 = (this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
             super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    defaultConfigs.
    super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_payload._0_8_ = 0;
    defaultConfigs.
    super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_payload._8_8_ = 0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&defaultConfigs);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)&crossConfigs,
                        (cmListFileBacktrace *)&defaultConfigs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&defaultConfigs.
                       super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_payload._M_value._M_t + 8));
    std::__cxx11::string::~string((string *)&crossConfigs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    bVar3 = false;
    goto LAB_00412154;
  }
  _Var1._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (((this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.super_cmGlobalGenerator.
         Makefiles.
         super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&crossConfigs,"CMAKE_CROSS_CONFIGS",(allocator<char> *)&defaultConfigs);
  psVar6 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      _Var1._M_t.
                      super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                      (string *)&crossConfigs);
  std::__cxx11::string::string((string *)&msg,(string *)psVar6);
  init_00._M_len = 1;
  init_00._M_array = (iterator)&msg;
  cmList::cmList(&crossConfigsList,init_00);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&crossConfigs);
  cmGlobalNinjaGenerator::ListSubsetWithAll
            (&crossConfigs,&configs,&configs,&crossConfigsList.Values);
  if (crossConfigs.
      super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_engaged == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar7 = std::operator<<((ostream *)&msg,"CMAKE_CROSS_CONFIGS is not a subset of ");
    std::operator<<(poVar7,"CMAKE_CONFIGURATION_TYPES");
    pcVar2 = (this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
             super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    defaultConfigsString._M_dataplus._M_p = (pointer)0x0;
    defaultConfigsString._M_string_length = 0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&defaultConfigsString);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)&defaultConfigs,
                        (cmListFileBacktrace *)&defaultConfigsString);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&defaultConfigsString._M_string_length)
    ;
    std::__cxx11::string::~string((string *)&defaultConfigs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    bVar3 = false;
  }
  else {
    this_00 = &(this->super_cmGlobalNinjaGenerator).CrossConfigs;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_00->_M_t,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&crossConfigs);
    _Var1._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
    super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
         (((this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
           super_cmGlobalGenerator.Makefiles.
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"CMAKE_DEFAULT_CONFIGS",(allocator<char> *)&defaultConfigs);
    psVar6 = cmMakefile::GetSafeDefinition
                       ((cmMakefile *)
                        _Var1._M_t.
                        super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(string *)&msg);
    std::__cxx11::string::string((string *)&defaultConfigsString,(string *)psVar6);
    std::__cxx11::string::~string((string *)&msg);
    if (defaultConfigsString._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&defaultConfigsString);
      if (defaultConfigsString._M_string_length != 0) goto LAB_00411dfa;
LAB_00411e25:
      cmList::cmList(&defaultConfigsList,&defaultConfigsString,Yes,No);
      if ((this->super_cmGlobalNinjaGenerator).DefaultFileConfig._M_string_length == 0) {
LAB_00412086:
        bVar3 = true;
      }
      else {
        cmGlobalNinjaGenerator::GetCrossConfigs
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&msg,&this->super_cmGlobalNinjaGenerator,psVar4);
        cmGlobalNinjaGenerator::ListSubsetWithAll
                  (&defaultConfigs,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&msg,this_00,&defaultConfigsList.Values);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&msg);
        if (defaultConfigs.
            super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_engaged == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
          std::operator<<((ostream *)&msg,
                          "CMAKE_DEFAULT_CONFIGS is not a subset of CMAKE_CROSS_CONFIGS");
          pcVar2 = (this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
                   super_cmGlobalGenerator.CMakeInstance;
          std::__cxx11::stringbuf::str();
          local_238.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_238.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_238);
          cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_228,(cmListFileBacktrace *)&local_238);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_238.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
        }
        else {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&(this->super_cmGlobalNinjaGenerator).DefaultConfigs._M_t,
                      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&defaultConfigs);
        }
        std::
        _Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_reset((_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&defaultConfigs);
        if (defaultConfigs.
            super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_engaged != false) goto LAB_00412086;
        bVar3 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&defaultConfigsList.Values);
    }
    else {
LAB_00411dfa:
      bVar3 = std::operator!=(&defaultConfigsString,psVar4);
      if ((!bVar3) ||
         (((this->super_cmGlobalNinjaGenerator).DefaultFileConfig._M_string_length != 0 &&
          ((this->super_cmGlobalNinjaGenerator).CrossConfigs._M_t._M_impl.super__Rb_tree_header.
           _M_node_count != 0)))) goto LAB_00411e25;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar7 = std::operator<<((ostream *)&msg,"CMAKE_DEFAULT_CONFIGS cannot be used without ");
      std::operator<<(poVar7,"CMAKE_DEFAULT_BUILD_TYPE or CMAKE_CROSS_CONFIGS");
      pcVar2 = (this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
               super_cmGlobalGenerator.CMakeInstance;
      std::__cxx11::stringbuf::str();
      local_228._M_dataplus._M_p = (pointer)0x0;
      local_228._M_string_length = 0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_228);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)&defaultConfigs,
                          (cmListFileBacktrace *)&local_228);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length);
      std::__cxx11::string::~string((string *)&defaultConfigs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&defaultConfigsString);
  }
  std::
  _Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_reset((_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&crossConfigs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&crossConfigsList.Values);
LAB_00412154:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&configs._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configsList.Values);
  return bVar3;
}

Assistant:

bool cmGlobalNinjaMultiGenerator::InspectConfigTypeVariables()
{
  cmList configsList{ this->Makefiles.front()->GetDefinition(
    "CMAKE_CONFIGURATION_TYPES") };
  if (configsList.empty()) {
    configsList.emplace_back();
  }
  std::set<std::string> configs(configsList.cbegin(), configsList.cend());

  this->DefaultFileConfig =
    this->Makefiles.front()->GetSafeDefinition("CMAKE_DEFAULT_BUILD_TYPE");
  if (this->DefaultFileConfig.empty()) {
    this->DefaultFileConfig = configsList.front();
  }
  if (!configs.count(this->DefaultFileConfig)) {
    std::ostringstream msg;
    msg << "The configuration specified by "
        << "CMAKE_DEFAULT_BUILD_TYPE (" << this->DefaultFileConfig
        << ") is not present in CMAKE_CONFIGURATION_TYPES";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           msg.str());
    return false;
  }

  cmList crossConfigsList{ this->Makefiles.front()->GetSafeDefinition(
    "CMAKE_CROSS_CONFIGS") };
  auto crossConfigs = ListSubsetWithAll(configs, configs, crossConfigsList);
  if (!crossConfigs) {
    std::ostringstream msg;
    msg << "CMAKE_CROSS_CONFIGS is not a subset of "
        << "CMAKE_CONFIGURATION_TYPES";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           msg.str());
    return false;
  }
  this->CrossConfigs = *crossConfigs;

  auto defaultConfigsString =
    this->Makefiles.front()->GetSafeDefinition("CMAKE_DEFAULT_CONFIGS");
  if (defaultConfigsString.empty()) {
    defaultConfigsString = this->DefaultFileConfig;
  }
  if (!defaultConfigsString.empty() &&
      defaultConfigsString != this->DefaultFileConfig &&
      (this->DefaultFileConfig.empty() || this->CrossConfigs.empty())) {
    std::ostringstream msg;
    msg << "CMAKE_DEFAULT_CONFIGS cannot be used without "
        << "CMAKE_DEFAULT_BUILD_TYPE or CMAKE_CROSS_CONFIGS";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           msg.str());
    return false;
  }

  cmList defaultConfigsList(defaultConfigsString);
  if (!this->DefaultFileConfig.empty()) {
    auto defaultConfigs =
      ListSubsetWithAll(this->GetCrossConfigs(this->DefaultFileConfig),
                        this->CrossConfigs, defaultConfigsList);
    if (!defaultConfigs) {
      std::ostringstream msg;
      msg << "CMAKE_DEFAULT_CONFIGS is not a subset of CMAKE_CROSS_CONFIGS";
      this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                             msg.str());
      return false;
    }
    this->DefaultConfigs = *defaultConfigs;
  }

  return true;
}